

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_time.c
# Opt level: O2

void * timer_new(t_symbol *unitname,t_floatarg tempo)

{
  t_timer *x;
  t_symbol *ptVar1;
  t_symbol *s2;
  
  x = (t_timer *)pd_new(timer_class);
  x->x_unit = 1.0;
  x->x_samps = 0;
  timer_bang(x);
  ptVar1 = gensym("float");
  outlet_new((t_object *)x,ptVar1);
  ptVar1 = gensym("bang");
  s2 = gensym("bang2");
  inlet_new((t_object *)x,(t_pd *)x,ptVar1,s2);
  if ((tempo != 0.0) || (NAN(tempo))) {
    timer_tempo(x,unitname,tempo);
  }
  return x;
}

Assistant:

static void *timer_new(t_symbol *unitname, t_floatarg tempo)
{
    t_timer *x = (t_timer *)pd_new(timer_class);
    x->x_unit = 1;
    x->x_samps = 0;
    timer_bang(x);
    outlet_new(&x->x_obj, gensym("float"));
    inlet_new(&x->x_obj, &x->x_obj.ob_pd, gensym("bang"), gensym("bang2"));
    if (tempo != 0)
        timer_tempo(x, unitname, tempo);
    return (x);
}